

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_coc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  jpc_coc_t *coc;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  if (0x20 < (ms->parms).coc.compparms.numdlvls) {
    __assert_fail("coc->compparms.numdlvls <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_cs.c"
                  ,0x2e7,"int jpc_coc_putparms(jpc_ms_t *, jpc_cstate_t *, jas_stream_t *)");
  }
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_putuint8(out,(uint_fast8_t)(ms->parms).sot.tileno);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    iVar1 = jpc_putuint16(out,(ms->parms).sot.tileno);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = jpc_putuint8(out,(ms->parms).coc.compparms.csty);
  if (iVar1 == 0) {
    iVar1 = jpc_cox_putcompparms
                      (ms,cstate,out,(uint)(((ms->parms).coc.compparms.csty & 1) != 0),
                       &(ms->parms).coc.compparms);
    if (iVar1 == 0) {
      ms_local._4_4_ = 0;
    }
    else {
      ms_local._4_4_ = -1;
    }
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_coc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_coc_t *coc = &ms->parms.coc;
	assert(coc->compparms.numdlvls <= 32);
	if (cstate->numcomps <= 256) {
		if (jpc_putuint8(out, coc->compno)) {
			return -1;
		}
	} else {
		if (jpc_putuint16(out, coc->compno)) {
			return -1;
		}
	}
	if (jpc_putuint8(out, coc->compparms.csty)) {
		return -1;
	}
	if (jpc_cox_putcompparms(ms, cstate, out,
	  (coc->compparms.csty & JPC_COX_PRT) != 0, &coc->compparms)) {
		return -1;
	}
	return 0;
}